

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall CEditor::RenderLayers(CEditor *this,CUIRect ToolBox,CUIRect View)

{
  bool *pbVar1;
  long lVar2;
  CLayer *pCVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  CLayerGroup **ppCVar7;
  ulong uVar8;
  char *pcVar9;
  CLayerGroup *pCVar10;
  int iVar11;
  long in_FS_OFFSET;
  float fVar12;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  CUIRect SaveCheck;
  CUIRect VisibleToggle;
  CUIRect Button;
  CUIRect Slot;
  CUIRect local_88;
  char aBuf [64];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (ulong)(this->m_Map).m_lGroups.num_elements;
  if ((long)uVar6 < 1) {
    fVar15 = 12.0;
  }
  else {
    fVar15 = 12.0;
    uVar8 = 0;
    do {
      fVar15 = fVar15 + 19.0;
      pCVar10 = (this->m_Map).m_lGroups.list[uVar8];
      if (pCVar10->m_Collapse == false) {
        fVar15 = fVar15 + (float)(pCVar10->m_lLayers).num_elements * 14.0;
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  fVar16 = fVar15 - ToolBox.h;
  local_88 = ToolBox;
  if (ToolBox.h < fVar15) {
    CUIRect::VSplitRight(&local_88,15.0,&local_88,(CUIRect *)aBuf);
    CUIRect::VSplitRight(&local_88,3.0,&local_88,(CUIRect *)0x0);
    RenderLayers::s_ScrollValue =
         CUI::DoScrollbarV(&this->m_UI,&RenderLayers::s_ScrollValue,(CUIRect *)aBuf,
                           RenderLayers::s_ScrollValue);
    bVar4 = CUIRect::Inside((CUIRect *)aBuf,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY);
    if ((bVar4) ||
       (bVar4 = CUIRect::Inside(&local_88,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY), bVar4)) {
      iVar11 = (int)((fVar15 - local_88.h) / 15.0);
      if (-1 < iVar11) {
        iVar5 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1a4,0);
        fVar14 = (float)(iVar11 + 1);
        if ((char)iVar5 != '\0') {
          fVar12 = RenderLayers::s_ScrollValue - 1.0 / fVar14;
          fVar13 = 1.0;
          if (fVar12 <= 1.0) {
            fVar13 = fVar12;
          }
          RenderLayers::s_ScrollValue = (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar13);
        }
        iVar11 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1a5,0);
        if ((char)iVar11 != '\0') {
          fVar13 = 1.0 / fVar14 + RenderLayers::s_ScrollValue;
          fVar14 = 1.0;
          if (fVar13 <= 1.0) {
            fVar14 = fVar13;
          }
          RenderLayers::s_ScrollValue = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar14);
        }
      }
    }
    uVar6 = (ulong)(uint)(this->m_Map).m_lGroups.num_elements;
  }
  fVar15 = fVar15 - (1.0 - RenderLayers::s_ScrollValue) * fVar16;
  fVar14 = 0.0;
  if ((0 < (int)uVar6) && (0.0 <= fVar15)) {
    fVar16 = fVar16 * RenderLayers::s_ScrollValue;
    fVar13 = 0.0;
    if (0.0 <= fVar16) {
      fVar13 = fVar16;
    }
    uVar8 = 0;
    do {
      ppCVar7 = (this->m_Map).m_lGroups.list;
      pCVar10 = ppCVar7[uVar8];
      iVar11 = (pCVar10->m_lLayers).num_elements;
      if (fVar13 <= (float)iVar11 * 14.0 + fVar14 + 19.0) {
        if (fVar13 <= fVar14) {
          CUIRect::HSplitTop(&local_88,12.0,&Slot,&local_88);
          CUIRect::VSplitLeft(&Slot,12.0,&VisibleToggle,&Slot);
          pCVar10 = (this->m_Map).m_lGroups.list[uVar8];
          pcVar9 = "H";
          if (pCVar10->m_Visible != false) {
            pcVar9 = "V";
          }
          iVar11 = DoButton_Ex(this,&pCVar10->m_Visible,pcVar9,(uint)pCVar10->m_Collapse,
                               &VisibleToggle,0,"Toggle group visibility",5,10.0);
          if (iVar11 != 0) {
            pbVar1 = &(this->m_Map).m_lGroups.list[uVar8]->m_Visible;
            *pbVar1 = (bool)(*pbVar1 ^ 1);
          }
          CUIRect::VSplitRight(&Slot,12.0,&Slot,&SaveCheck);
          pCVar10 = (this->m_Map).m_lGroups.list[uVar8];
          iVar11 = DoButton_Ex(this,&pCVar10->m_SaveToMap,"S",(uint)pCVar10->m_SaveToMap,&SaveCheck,
                               0,"Enable/disable group for saving",10,10.0);
          pCVar10 = (this->m_Map).m_lGroups.list[uVar8];
          if ((iVar11 != 0) && (pCVar10->m_GameGroup == false)) {
            pCVar10->m_SaveToMap = (bool)(pCVar10->m_SaveToMap ^ 1);
          }
          str_format(aBuf,0x40,"#%d %s",uVar8 & 0xffffffff,pCVar10->m_aName);
          fVar12 = Slot.w * 10.0;
          (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
                    (this->m_pTextRender,aBuf,0xffffffff);
          fVar12 = fVar12 / extraout_XMM0_Da;
          fVar16 = 10.0;
          if (fVar12 <= 10.0) {
            fVar16 = fVar12;
          }
          ppCVar7 = (this->m_Map).m_lGroups.list + uVar8;
          pcVar9 = "Select group. Double click to collapse.";
          if ((*ppCVar7)->m_Collapse != false) {
            pcVar9 = "Select group. Double click to expand.";
          }
          iVar11 = DoButton_Ex(this,ppCVar7,aBuf,(uint)(uVar8 == (uint)this->m_SelectedGroup),&Slot,
                               1,pcVar9,0,
                               (float)(-(uint)(fVar12 < 6.0) & 0x40c00000 |
                                      ~-(uint)(fVar12 < 6.0) & (uint)fVar16));
          if (iVar11 != 0) {
            this->m_SelectedGroup = (int)uVar8;
            this->m_SelectedLayer = 0;
            if (iVar11 == 2) {
              CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,
                               0x91,0xdc,this,PopupGroup,0xf);
            }
            if ((((this->m_Map).m_lGroups.list[uVar8]->m_lLayers).num_elements != 0) &&
               (iVar11 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[0xb])(),
               (char)iVar11 != '\0')) {
              pbVar1 = &(this->m_Map).m_lGroups.list[uVar8]->m_Collapse;
              *pbVar1 = (bool)(*pbVar1 ^ 1);
            }
          }
          CUIRect::HSplitTop(&local_88,2.0,&Slot,&local_88);
          ppCVar7 = (this->m_Map).m_lGroups.list;
          pCVar10 = ppCVar7[uVar8];
          iVar11 = (pCVar10->m_lLayers).num_elements;
        }
        fVar14 = fVar14 + 14.0;
        if ((0 < iVar11) && (fVar14 <= fVar15)) {
          uVar6 = 0;
          do {
            if (fVar13 <= fVar14) {
              if (pCVar10->m_Collapse == false) {
                CUIRect::HSplitTop(&local_88,12.0,&Slot,&local_88);
                CUIRect::VSplitLeft(&Slot,12.0,(CUIRect *)0x0,&Button);
                CUIRect::VSplitLeft(&Button,15.0,&VisibleToggle,&Button);
                pCVar3 = ((this->m_Map).m_lGroups.list[uVar8]->m_lLayers).list[uVar6];
                pcVar9 = "H";
                if (pCVar3->m_Visible != false) {
                  pcVar9 = "V";
                }
                iVar11 = DoButton_Ex(this,&pCVar3->m_Visible,pcVar9,0,&VisibleToggle,0,
                                     "Toggle layer visibility",5,10.0);
                if (iVar11 != 0) {
                  pbVar1 = &((this->m_Map).m_lGroups.list[uVar8]->m_lLayers).list[uVar6]->m_Visible;
                  *pbVar1 = (bool)(*pbVar1 ^ 1);
                }
                CUIRect::VSplitRight(&Button,12.0,&Button,&SaveCheck);
                pCVar3 = ((this->m_Map).m_lGroups.list[uVar8]->m_lLayers).list[uVar6];
                iVar11 = DoButton_Ex(this,&pCVar3->m_SaveToMap,"S",(uint)pCVar3->m_SaveToMap,
                                     &SaveCheck,0,"Enable/disable layer for saving",10,10.0);
                pCVar3 = ((this->m_Map).m_lGroups.list[uVar8]->m_lLayers).list[uVar6];
                if ((iVar11 != 0) && (pCVar3 != (CLayer *)(this->m_Map).m_pGameLayer)) {
                  pCVar3->m_SaveToMap = (bool)(pCVar3->m_SaveToMap ^ 1);
                }
                if (pCVar3->m_aName[0] == '\0') {
                  if (pCVar3->m_Type == 2) {
                    pcVar9 = "Tiles";
                  }
                  else {
                    pcVar9 = "Quads";
                  }
                  str_copy(aBuf,pcVar9,0x40);
                }
                else {
                  str_format(aBuf,0x40,"%s",pCVar3->m_aName);
                }
                fVar12 = Button.w * 10.0;
                (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
                          (this->m_pTextRender,aBuf,0xffffffff);
                fVar12 = fVar12 / extraout_XMM0_Da_00;
                fVar16 = 10.0;
                if (fVar12 <= 10.0) {
                  fVar16 = fVar12;
                }
                iVar11 = DoButton_Ex(this,((this->m_Map).m_lGroups.list[uVar8]->m_lLayers).list
                                          [uVar6],aBuf,
                                     (uint)((uint)this->m_SelectedLayer == uVar6 &&
                                           (uint)this->m_SelectedGroup == uVar8),&Button,1,
                                     "Select layer.",0,
                                     (float)(-(uint)(fVar12 < 6.0) & 0x40c00000 |
                                            ~-(uint)(fVar12 < 6.0) & (uint)fVar16));
                if (iVar11 != 0) {
                  this->m_SelectedLayer = (int)uVar6;
                  this->m_SelectedGroup = (int)uVar8;
                  if (iVar11 == 2) {
                    CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,
                                     (int)(this->m_UI).m_MouseY,0x78,0xf5,this,PopupLayer,0xf);
                  }
                }
                fVar14 = fVar14 + 14.0;
                CUIRect::HSplitTop(&local_88,2.0,&Slot,&local_88);
                ppCVar7 = (this->m_Map).m_lGroups.list;
              }
            }
            else {
              fVar14 = fVar14 + 14.0;
            }
            uVar6 = uVar6 + 1;
            pCVar10 = ppCVar7[uVar8];
          } while (((long)uVar6 < (long)(pCVar10->m_lLayers).num_elements) && (fVar14 <= fVar15));
        }
        if ((fVar13 < fVar14) && (fVar14 < fVar15)) {
          CUIRect::HSplitTop(&local_88,5.0,&Slot,&local_88);
        }
        fVar14 = fVar14 + 5.0;
        uVar6 = (ulong)(uint)(this->m_Map).m_lGroups.num_elements;
      }
      else {
        fVar14 = fVar14 + (float)iVar11 * 14.0 + 19.0;
      }
      uVar8 = uVar8 + 1;
    } while (((long)uVar8 < (long)(int)uVar6) && (fVar14 <= fVar15));
  }
  if (fVar14 <= fVar15) {
    CUIRect::HSplitTop(&local_88,12.0,&Slot,&local_88);
    iVar11 = DoButton_Editor(this,&RenderLayers::s_NewGroupButton,"Add group",0,&Slot,0,
                             "Adds a new group");
    if (iVar11 != 0) {
      CEditorMap::NewGroup(&this->m_Map);
      this->m_SelectedGroup = (this->m_Map).m_lGroups.num_elements + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::RenderLayers(CUIRect ToolBox, CUIRect View)
{
	CUIRect LayersBox = ToolBox;
	CUIRect Slot, Button;
	char aBuf[64];

	float LayersHeight = 12.0f;	 // Height of AddGroup button
	static float s_ScrollValue = 0;

	for(int g = 0; g < m_Map.m_lGroups.size(); g++)
	{
		// Each group is 19.0f
		// Each layer is 14.0f
		LayersHeight += 19.0f;
		if(!m_Map.m_lGroups[g]->m_Collapse)
			LayersHeight += m_Map.m_lGroups[g]->m_lLayers.size() * 14.0f;
	}

	float ScrollDifference = LayersHeight - LayersBox.h;

	if(LayersHeight > LayersBox.h)	// Do we even need a scrollbar?
	{
		CUIRect Scroll;
		LayersBox.VSplitRight(15.0f, &LayersBox, &Scroll);
		LayersBox.VSplitRight(3.0f, &LayersBox, 0);	// extra spacing
		s_ScrollValue = UI()->DoScrollbarV(&s_ScrollValue, &Scroll, s_ScrollValue);

		if(UI()->MouseInside(&Scroll) || UI()->MouseInside(&LayersBox))
		{
			int ScrollNum = (int)((LayersHeight-LayersBox.h)/15.0f)+1;
			if(ScrollNum > 0)
			{
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_UP))
					s_ScrollValue = clamp(s_ScrollValue - 1.0f/ScrollNum, 0.0f, 1.0f);
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_DOWN))
					s_ScrollValue = clamp(s_ScrollValue + 1.0f/ScrollNum, 0.0f, 1.0f);
			}
		}
	}

	float LayerStartAt = ScrollDifference * s_ScrollValue;
	if(LayerStartAt < 0.0f)
		LayerStartAt = 0.0f;

	float LayerStopAt = LayersHeight - ScrollDifference * (1 - s_ScrollValue);
	float LayerCur = 0;

	// render layers
	{
		for(int g = 0; g < m_Map.m_lGroups.size(); g++)
		{
			if(LayerCur > LayerStopAt)
				break;
			else if(LayerCur + m_Map.m_lGroups[g]->m_lLayers.size() * 14.0f + 19.0f < LayerStartAt)
			{
				LayerCur += m_Map.m_lGroups[g]->m_lLayers.size() * 14.0f + 19.0f;
				continue;
			}

			CUIRect VisibleToggle, SaveCheck;
			if(LayerCur >= LayerStartAt)
			{
				LayersBox.HSplitTop(12.0f, &Slot, &LayersBox);
				Slot.VSplitLeft(12, &VisibleToggle, &Slot);
				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_Visible, m_Map.m_lGroups[g]->m_Visible?"V":"H", m_Map.m_lGroups[g]->m_Collapse ? 1 : 0, &VisibleToggle, 0, "Toggle group visibility", CUIRect::CORNER_L))
					m_Map.m_lGroups[g]->m_Visible = !m_Map.m_lGroups[g]->m_Visible;

				Slot.VSplitRight(12.0f, &Slot, &SaveCheck);
				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_SaveToMap, "S", m_Map.m_lGroups[g]->m_SaveToMap, &SaveCheck, 0, "Enable/disable group for saving", CUIRect::CORNER_R))
					if(!m_Map.m_lGroups[g]->m_GameGroup)
						m_Map.m_lGroups[g]->m_SaveToMap = !m_Map.m_lGroups[g]->m_SaveToMap;

				str_format(aBuf, sizeof(aBuf),"#%d %s", g, m_Map.m_lGroups[g]->m_aName);
				const float FontSize = clamp(10.0f * Slot.w / TextRender()->TextWidth(10.0f, aBuf, -1), 6.0f, 10.0f);

				if(int Result = DoButton_Ex(&m_Map.m_lGroups[g], aBuf, g==m_SelectedGroup, &Slot,
					BUTTON_CONTEXT, m_Map.m_lGroups[g]->m_Collapse ? "Select group. Double click to expand." : "Select group. Double click to collapse.", 0, FontSize))
				{
					m_SelectedGroup = g;
					m_SelectedLayer = 0;

					if(Result == 2)
						UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 145, 220, this, PopupGroup);

					if(m_Map.m_lGroups[g]->m_lLayers.size() && Input()->MouseDoubleClick())
						m_Map.m_lGroups[g]->m_Collapse ^= 1;
				}
				LayersBox.HSplitTop(2.0f, &Slot, &LayersBox);
			}
			LayerCur += 14.0f;

			for(int i = 0; i < m_Map.m_lGroups[g]->m_lLayers.size(); i++)
			{
				if(LayerCur > LayerStopAt)
					break;
				else if(LayerCur < LayerStartAt)
				{
					LayerCur += 14.0f;
					continue;
				}

				if(m_Map.m_lGroups[g]->m_Collapse)
					continue;

				//visible
				LayersBox.HSplitTop(12.0f, &Slot, &LayersBox);
				Slot.VSplitLeft(12.0f, 0, &Button);
				Button.VSplitLeft(15, &VisibleToggle, &Button);

				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible, m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible?"V":"H", 0, &VisibleToggle, 0, "Toggle layer visibility", CUIRect::CORNER_L))
					m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible = !m_Map.m_lGroups[g]->m_lLayers[i]->m_Visible;

				Button.VSplitRight(12.0f, &Button, &SaveCheck);
				if(DoButton_Ex(&m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap, "S", m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap, &SaveCheck, 0, "Enable/disable layer for saving", CUIRect::CORNER_R))
					if(m_Map.m_lGroups[g]->m_lLayers[i] != m_Map.m_pGameLayer)
						m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap = !m_Map.m_lGroups[g]->m_lLayers[i]->m_SaveToMap;

				if(m_Map.m_lGroups[g]->m_lLayers[i]->m_aName[0])
					str_format(aBuf, sizeof(aBuf), "%s", m_Map.m_lGroups[g]->m_lLayers[i]->m_aName);
				else if(m_Map.m_lGroups[g]->m_lLayers[i]->m_Type == LAYERTYPE_TILES)
					str_copy(aBuf, "Tiles", sizeof(aBuf));
				else
					str_copy(aBuf, "Quads", sizeof(aBuf));

				const float FontSize = clamp(10.0f * Button.w / TextRender()->TextWidth(10.0f, aBuf, -1), 6.0f, 10.0f);

				if(int Result = DoButton_Ex(m_Map.m_lGroups[g]->m_lLayers[i], aBuf, g==m_SelectedGroup&&i==m_SelectedLayer, &Button,
					BUTTON_CONTEXT, "Select layer.", 0, FontSize))
				{
					m_SelectedLayer = i;
					m_SelectedGroup = g;
					if(Result == 2)
						UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 245, this, PopupLayer);
				}

				LayerCur += 14.0f;
				LayersBox.HSplitTop(2.0f, &Slot, &LayersBox);
			}
			if(LayerCur > LayerStartAt && LayerCur < LayerStopAt)
				LayersBox.HSplitTop(5.0f, &Slot, &LayersBox);
			LayerCur += 5.0f;
		}
	}

	if(LayerCur <= LayerStopAt)
	{
		LayersBox.HSplitTop(12.0f, &Slot, &LayersBox);

		static int s_NewGroupButton = 0;
		if(DoButton_Editor(&s_NewGroupButton, "Add group", 0, &Slot, 0, "Adds a new group"))
		{
			m_Map.NewGroup();
			m_SelectedGroup = m_Map.m_lGroups.size()-1;
		}
	}
}